

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O1

void __thiscall cxxpool::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  code *local_60;
  undefined8 local_58;
  thread local_50;
  thread_pool *local_48;
  pthread_mutex_t *local_40;
  thread local_38;
  thread thread;
  
  thread_pool(this);
  if (n_threads != 0) {
    local_40 = (pthread_mutex_t *)&this->thread_mutex_;
    iVar1 = pthread_mutex_lock(local_40);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    uVar2 = (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar3 = n_threads + uVar2;
    if (uVar2 < uVar3) {
      do {
        local_38._M_id._M_thread = (id)0;
        local_60 = worker;
        local_58 = 0;
        local_48 = this;
        std::thread::thread<void(cxxpool::thread_pool::*)(),cxxpool::thread_pool*,void>
                  (&local_50,(offset_in_thread_pool_to_subr *)&local_60,&local_48);
        if (local_38._M_id._M_thread != 0) {
LAB_001af86b:
          std::terminate();
        }
        local_38._M_id._M_thread = local_50._M_id._M_thread;
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&this->threads_,&local_38);
        if (local_38._M_id._M_thread != 0) goto LAB_001af86b;
      } while ((ulong)((long)(this->threads_).
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->threads_).
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) < uVar3);
    }
    pthread_mutex_unlock(local_40);
  }
  return;
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : thread_pool{}
    {
        if (n_threads > 0) {
            std::lock_guard<std::mutex> thread_lock(thread_mutex_);
            const auto n_target = threads_.size() + n_threads;
            while (threads_.size() < n_target) {
                std::thread thread;
                try {
                    thread = std::thread{&thread_pool::worker, this};
                } catch (...) {
                    shutdown();
                    throw;
                }
                try {
                    threads_.push_back(std::move(thread));
                } catch (...) {
                    shutdown();
                    thread.join();
                    throw;
                }
            }
        }
    }